

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::CanonicalizePath_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view path)

{
  undefined8 uVar1;
  size_t sVar2;
  string *psVar3;
  string *extraout_RAX;
  char *pcVar4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  canonical_parts;
  const_iterator __begin2;
  string_view part;
  strings_internal *local_b8;
  iterator iStack_b0;
  basic_string_view<char,_std::char_traits<char>_> *local_a8;
  undefined1 local_98 [16];
  size_t local_88;
  char *pcStack_80;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_78;
  DelimiterType local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  char *local_58;
  string *local_50;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  pcVar4 = (char *)path._M_len;
  local_b8 = (strings_internal *)0x0;
  iStack_b0._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_a8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  if ((this != (compiler *)0x0) && (*pcVar4 == '/')) {
    local_98._0_8_ = 0;
    local_98._8_8_ = "";
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&local_b8,(iterator)0x0,
               (basic_string_view<char,_std::char_traits<char>_> *)local_98);
  }
  uVar1 = local_98._8_8_;
  local_78 = &local_48;
  local_48.delimiter_.c_ = '/';
  local_98._0_8_ = (compiler *)0x0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  pcStack_80 = (char *)0x0;
  local_70.c_ = '/';
  local_58 = pcVar4;
  local_50 = __return_storage_ptr__;
  local_48.text_._M_len = (size_t)this;
  local_48.text_._M_str = pcVar4;
  if (pcVar4 == (char *)0x0) {
    local_98._12_4_ = SUB84(uVar1,4);
    local_98._8_4_ = 2;
    local_98._0_8_ = this;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_98);
  }
  sVar2 = local_48.text_._M_len;
  while ((psVar3 = local_50, local_98._8_4_ != kEndState || (local_98._0_8_ != sVar2))) {
    local_68._M_len = local_88;
    local_68._M_str = pcStack_80;
    if ((local_88 != 1) || (*pcStack_80 != '.')) {
      if (iStack_b0._M_current == local_a8) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_b8,iStack_b0,&local_68);
      }
      else {
        (iStack_b0._M_current)->_M_len = local_88;
        (iStack_b0._M_current)->_M_str = pcStack_80;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
    }
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_98);
  }
  if ((this != (compiler *)0x0) && ((local_58 + -1)[(long)this] == '/')) {
    local_98._0_8_ = (compiler *)0x0;
    local_98._8_8_ = "";
    if (iStack_b0._M_current == local_a8) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&local_b8,iStack_b0,(basic_string_view<char,_std::char_traits<char>_> *)local_98
                );
    }
    else {
      (iStack_b0._M_current)->_M_len = 0;
      (iStack_b0._M_current)->_M_str = "";
      iStack_b0._M_current = iStack_b0._M_current + 1;
    }
  }
  psVar3 = absl::lts_20250127::strings_internal::
           JoinAlgorithm<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,void>
                     (psVar3,local_b8,iStack_b0._M_current,1,"/");
  if (local_b8 != (strings_internal *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string CanonicalizePath(absl::string_view path) {
#ifdef _WIN32
  // The Win32 API accepts forward slashes as a path delimiter even though
  // backslashes are standard.  Let's avoid confusion and use only forward
  // slashes.
  std::string path_str;
  if (absl::StartsWith(path, "\\\\")) {
    // Avoid converting two leading backslashes.
    path_str = absl::StrCat("\\\\",
                            absl::StrReplaceAll(path.substr(2), {{"\\", "/"}}));
  } else {
    path_str = absl::StrReplaceAll(path, {{"\\", "/"}});
  }
  path = path_str;
#endif

  std::vector<absl::string_view> canonical_parts;
  if (!path.empty() && path.front() == '/') canonical_parts.push_back("");
  for (absl::string_view part : absl::StrSplit(path, '/', absl::SkipEmpty())) {
    if (part == ".") {
      // Ignore.
    } else {
      canonical_parts.push_back(part);
    }
  }
  if (!path.empty() && path.back() == '/') canonical_parts.push_back("");

  return absl::StrJoin(canonical_parts, "/");
}